

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.h
# Opt level: O3

Client * operator<<(Client *stream,Response *resp)

{
  long lVar1;
  ostream *poVar2;
  ulong __n;
  void *__buf;
  element_type *peVar3;
  ulong uVar4;
  long *in_FS_OFFSET;
  stringstream ss;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,(resp->protocol)._M_dataplus._M_p,(resp->protocol)._M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(resp->status).status._M_dataplus._M_p,
                      (resp->status).status._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Date: ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(resp->date)._M_dataplus._M_p,(resp->date)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Server: ",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(resp->server)._M_dataplus._M_p,(resp->server)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Content-Length: ",0x10);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Connection: ",0xc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(resp->connection)._M_dataplus._M_p,(resp->connection)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Content-Type: ",0xe);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(resp->content_type)._M_dataplus._M_p,
                      (resp->content_type)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\r\n",2);
  std::__cxx11::stringbuf::str();
  Client::operator<<(stream,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  peVar3 = (resp->body).
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    __n = resp->content_length;
    if (0x18fff < __n) {
      lVar1 = *in_FS_OFFSET;
      uVar4 = 0;
      do {
        std::istream::read((char *)(resp->body).
                                   super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,lVar1 + -0x19000);
        Client::write(stream,(int)(lVar1 + -0x19000),(void *)0x19000,__n);
        uVar4 = uVar4 + 1;
        __n = resp->content_length;
      } while (uVar4 < __n / 0x19000);
      peVar3 = (resp->body).
               super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    }
    if (__n != (__n / 0x19000) * 0x19000) {
      lVar1 = *in_FS_OFFSET;
      std::istream::read((char *)peVar3,lVar1 + -0x19000);
      __buf = (void *)(resp->content_length % 0x19000);
      Client::write(stream,(int)(lVar1 + -0x19000),__buf,(size_t)__buf);
      peVar3 = (resp->body).
               super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    }
    std::ios::clear((int)peVar3 + (int)*(undefined8 *)(*(long *)peVar3 + -0x18));
    std::istream::seekg((long)(resp->body).
                              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,_S_beg);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return stream;
}

Assistant:

T& operator<<(T& stream, const Response& resp) {
    std::stringstream ss;
    ss  << resp.protocol << " " << resp.status.code    << " " << resp.status.status << "\r\n"
        << "Date: "             << resp.date           << "\r\n"
        << "Server: "           << resp.server         << "\r\n"
        << "Content-Length: "   << resp.content_length << "\r\n"
        << "Connection: "       << resp.connection     << "\r\n"
        << "Content-Type: "     << resp.content_type   << "\r\n"
        << "\r\n";

    stream << ss.str();

    if (resp.body) {
        size_t bytes_count = BUFFER_SIZE * sizeof(Byte); 

        for (unsigned long i = 0; i < resp.content_length / bytes_count; i++) {
            resp.body->read(static_cast<char*>(buff), bytes_count);
            stream.write(static_cast<char*>(buff), bytes_count);
        }
        if (resp.content_length % bytes_count) {
            resp.body->read(static_cast<char*>(buff), resp.content_length % bytes_count);
            stream.write(static_cast<char*>(buff), resp.content_length % bytes_count);
        }

        resp.body->clear();
        resp.body->seekg(0, std::ios::beg);
    }

    return stream;
}